

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void __thiscall Imf_2_5::Header::readFrom(Header *this,IStream *is,int *version)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  char *__s1;
  OpaqueAttribute *this_00;
  mapped_type *ppAVar5;
  ostream *poVar6;
  InputExc *pIVar7;
  stringstream *typeName_00;
  int iVar8;
  stringstream _iex_throw_s;
  ostream local_3b0 [376];
  char typeName [256];
  char name [256];
  
  iVar8 = 0;
  while( true ) {
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,0xff,name);
    if (name[0] == '\0') {
      this->_readsNothing = iVar8 == 0;
      return;
    }
    (anonymous_namespace)::checkIsNullTerminated<256ul>(&name,"attribute name");
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,0xff,typeName);
    (anonymous_namespace)::checkIsNullTerminated<256ul>(&typeName,"attribute type name");
    (*is->_vptr_IStream[3])(is,&_iex_throw_s,4);
    uVar1 = __iex_throw_s;
    if ((int)__iex_throw_s < 0) break;
    Name::Name((Name *)&_iex_throw_s,name);
    typeName_00 = &_iex_throw_s;
    iVar4 = std::
            _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
            ::find((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                    *)this,(key_type *)&_iex_throw_s);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = Attribute::knownType((char *)0x526b69);
      if (bVar2) {
        this_00 = (OpaqueAttribute *)
                  Attribute::newAttribute((Attribute *)typeName,(char *)typeName_00);
      }
      else {
        this_00 = (OpaqueAttribute *)operator_new(0x40);
        OpaqueAttribute::OpaqueAttribute(this_00,typeName);
      }
      (*(this_00->super_Attribute)._vptr_Attribute[5])
                (this_00,is,(ulong)uVar1,(ulong)(uint)*version);
      Name::Name((Name *)&_iex_throw_s,name);
      ppAVar5 = std::
                map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                ::operator[](&this->_map,(key_type *)&_iex_throw_s);
      *ppAVar5 = &this_00->super_Attribute;
    }
    else {
      __s1 = (char *)(**(code **)(**(long **)(iVar4._M_node + 9) + 0x10))();
      iVar3 = strncmp(__s1,typeName,0x100);
      if (iVar3 != 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar6 = std::operator<<(local_3b0,"Unexpected type for image attribute \"");
        poVar6 = std::operator<<(poVar6,name);
        std::operator<<(poVar6,"\".");
        pIVar7 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar7,(stringstream *)&_iex_throw_s);
        __cxa_throw(pIVar7,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      (**(code **)(**(long **)(iVar4._M_node + 9) + 0x28))
                (*(long **)(iVar4._M_node + 9),is,uVar1,*version);
    }
    iVar8 = iVar8 + -1;
  }
  pIVar7 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar7,"Invalid size field in header attribute");
  __cxa_throw(pIVar7,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
Header::readFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int &version)
{
    //
    // Read all attributes.
    //

    int attrCount = 0;

    while (true)
    {
	//
	// Read the name of the attribute.
	// A zero-length attribute name indicates the end of the header.
	//

	char name[Name::SIZE];
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, Name::MAX_LENGTH, name);

	if (name[0] == 0)
	{
	    if (attrCount == 0) _readsNothing = true;
	    else                _readsNothing = false;
	    break;
	}

	attrCount++;

	checkIsNullTerminated (name, "attribute name");

	//
	// Read the attribute type and the size of the attribute value.
	//

	char typeName[Name::SIZE];
	int size;

	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, Name::MAX_LENGTH, typeName);
	checkIsNullTerminated (typeName, "attribute type name");
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, size);

    if( size < 0 )
    {
        throw IEX_NAMESPACE::InputExc("Invalid size field in header attribute");
    }

	AttributeMap::iterator i = _map.find (name);

	if (i != _map.end())
	{
	    //
	    // The attribute already exists (for example,
	    // because it is a predefined attribute).
	    // Read the attribute's new value from the file.
	    //

	    if (strncmp (i->second->typeName(), typeName, sizeof (typeName)))
		THROW (IEX_NAMESPACE::InputExc, "Unexpected type for image attribute "
				      "\"" << name << "\".");

	    i->second->readValueFrom (is, size, version);
	}
	else
	{
	    //
	    // The new attribute does not exist yet.
	    // If the attribute type is of a known type,
	    // read the attribute value.  If the attribute
	    // is of an unknown type, read its value and
	    // store it as an OpaqueAttribute.
	    //

	    Attribute *attr;

	    if (Attribute::knownType (typeName))
		attr = Attribute::newAttribute (typeName);
	    else
		attr = new OpaqueAttribute (typeName);

	    try
	    {
		attr->readValueFrom (is, size, version);
		_map[name] = attr;
	    }
	    catch (...)
	    {
		delete attr;
		throw;
	    }
	}
    }
}